

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O3

size_t __thiscall rr::PrimitiveList::getIndex(PrimitiveList *this,size_t elementNdx)

{
  IndexType IVar1;
  void *pvVar2;
  uint uVar3;
  
  pvVar2 = this->m_indices;
  if (pvVar2 != (void *)0x0) {
    IVar1 = this->m_indexType;
    if (IVar1 == INDEXTYPE_UINT32) {
      uVar3 = *(uint *)((long)pvVar2 + elementNdx * 4);
    }
    else if (IVar1 == INDEXTYPE_UINT16) {
      uVar3 = (uint)*(ushort *)((long)pvVar2 + elementNdx * 2);
    }
    else {
      uVar3 = 0;
      if (IVar1 == INDEXTYPE_UINT8) {
        uVar3 = (uint)*(byte *)((long)pvVar2 + elementNdx);
      }
    }
    return (long)(int)(this->m_baseVertex + uVar3);
  }
  return (long)this->m_baseVertex + elementNdx;
}

Assistant:

size_t PrimitiveList::getIndex (size_t elementNdx) const
{
	// indices == DE_NULL interpreted as command.indices = [first (=baseVertex) + 0, first + 1, first + 2...]
	if (m_indices)
	{
		int index = m_baseVertex + (int)readIndexArray(m_indexType, m_indices, elementNdx);
		DE_ASSERT(index >= 0); // do not access indices < 0

		return (size_t)index;
	}
	else
		return (size_t)(m_baseVertex) + elementNdx;
}